

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg_Data.h
# Opt level: O0

void __thiscall
Nova::Arg_Data::Arg_Data
          (Arg_Data *this,string *input_str,string *input_val_name,string *input_desc,
          string *default_value)

{
  string *input_desc_00;
  string *input_val_name_00;
  string *input_str_00;
  allocator local_61;
  string local_60 [48];
  string *local_30;
  string *default_value_local;
  string *input_desc_local;
  string *input_val_name_local;
  string *input_str_local;
  Arg_Data *this_local;
  
  this->type = STRING;
  local_30 = default_value;
  default_value_local = input_desc;
  input_desc_local = input_val_name;
  input_val_name_local = input_str;
  input_str_local = (string *)this;
  std::__cxx11::string::string((string *)&this->str);
  std::__cxx11::string::string((string *)&this->val_name);
  std::__cxx11::string::string((string *)&this->desc);
  this->boolean_value = false;
  this->integer_default = 0;
  this->integer_value = 0;
  this->double_default = 0.0;
  this->double_value = 0.0;
  Vector<double,_2,_true>::Vector(&this->vector_2d_default);
  Vector<double,_2,_true>::Vector(&this->vector_2d_value);
  Vector<double,_3,_true>::Vector(&this->vector_3d_default);
  Vector<double,_3,_true>::Vector(&this->vector_3d_value);
  std::__cxx11::string::string((string *)&this->string_default,(string *)local_30);
  std::__cxx11::string::string((string *)&this->string_value,(string *)local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->list_value);
  input_str_00 = input_val_name_local;
  input_val_name_00 = input_desc_local;
  input_desc_00 = default_value_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"string",&local_61);
  Initialize(this,input_str_00,input_val_name_00,input_desc_00,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

Arg_Data(const std::string& input_str,const std::string& input_val_name,const std::string& input_desc,const std::string& default_value)
        :type(STRING),boolean_value(false),integer_default(0),integer_value(0),double_default(0),double_value(0),string_default(default_value),string_value(default_value)
    {
        Initialize(input_str,input_val_name,input_desc,"string");
    }